

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::ChISO2631_Vibration_SeatCushionLogger
          (ChISO2631_Vibration_SeatCushionLogger *this)

{
  undefined1 auVar1 [64];
  
  this->m_tstart1 = 0.2;
  this->m_tstart2 = 0.5;
  auVar1 = ZEXT864(0) << 0x20;
  this->m_data_aw_z_avg = (vector<double,_std::allocator<double>_>)auVar1._0_24_;
  this->m_data_vdv_x_avg = (vector<double,_std::allocator<double>_>)auVar1._24_24_;
  (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  this->m_data_speed = (vector<double,_std::allocator<double>_>)auVar1._0_24_;
  this->m_data_acc_x = (vector<double,_std::allocator<double>_>)auVar1._24_24_;
  (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  *(undefined1 (*) [64])
   &(this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar1;
  *(undefined1 (*) [64])
   &(this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  this->m_data_aw_x_i = (vector<double,_std::allocator<double>_>)auVar1._0_24_;
  this->m_data_aw_y_i = (vector<double,_std::allocator<double>_>)auVar1._24_24_;
  (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  *(undefined1 (*) [64])
   &(this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar1;
  *(undefined1 (*) [64])
   &(this->m_data_vdv_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  *(undefined1 (*) [64])
   &(this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  ChISO2631_1_Wd::ChISO2631_1_Wd(&this->m_filter_wd_x);
  ChISO2631_1_Wd::ChISO2631_1_Wd(&this->m_filter_wd_y);
  ChISO2631_1_Wk::ChISO2631_1_Wk(&this->m_filter_wk_z);
  ChAbsorbed_Power_Vertical::ChAbsorbed_Power_Vertical(&this->m_filter_abspow);
  (this->m_filter_int_aw_x).super_ChAnalogueFilter._vptr_ChAnalogueFilter =
       (_func_int **)&PTR__ChAnalogueFilter_00b4cb40;
  (this->m_filter_int_aw_y).super_ChAnalogueFilter._vptr_ChAnalogueFilter =
       (_func_int **)&PTR__ChAnalogueFilter_00b4cb40;
  (this->m_filter_int_aw_z).super_ChAnalogueFilter._vptr_ChAnalogueFilter =
       (_func_int **)&PTR__ChAnalogueFilter_00b4cb40;
  (this->m_filter_int_vdv_x).super_ChAnalogueFilter._vptr_ChAnalogueFilter =
       (_func_int **)&PTR__ChAnalogueFilter_00b4cb40;
  (this->m_filter_int_vdv_y).super_ChAnalogueFilter._vptr_ChAnalogueFilter =
       (_func_int **)&PTR__ChAnalogueFilter_00b4cb40;
  (this->m_filter_int_vdv_z).super_ChAnalogueFilter._vptr_ChAnalogueFilter =
       (_func_int **)&PTR__ChAnalogueFilter_00b4cb40;
  return;
}

Assistant:

ChISO2631_Vibration_SeatCushionLogger::ChISO2631_Vibration_SeatCushionLogger() {}